

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O2

alignment_end *
sw_sse2_word(int8_t *ref,int8_t ref_dir,int32_t refLen,int32_t readLen,uint8_t weight_gapO,
            uint8_t weight_gapE,__m128i *vProfile,uint16_t terminate,int32_t maskLen)

{
  ulong *puVar1;
  ushort *puVar2;
  short *psVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  uint uVar10;
  undefined8 uVar11;
  void *__ptr;
  void *__ptr_00;
  void *pvVar12;
  void *__ptr_01;
  void *__ptr_02;
  alignment_end *paVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  size_t __nmemb;
  long lVar17;
  int iVar18;
  ulong uVar19;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  void *pvVar20;
  long lVar21;
  ushort uVar22;
  int iVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  short sVar51;
  short sVar54;
  undefined1 auVar52 [16];
  short sVar55;
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  undefined1 auVar57 [16];
  short sVar65;
  undefined1 auVar58 [16];
  ushort uVar66;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  undefined1 auVar67 [16];
  ulong local_60;
  short sVar75;
  
  iVar16 = readLen + -1;
  uVar15 = (long)(readLen + 7) / 8;
  __ptr = calloc((long)refLen,2);
  iVar23 = (int)uVar15;
  __nmemb = (size_t)iVar23;
  __ptr_00 = calloc(__nmemb,0x10);
  pvVar12 = calloc(__nmemb,0x10);
  __ptr_01 = calloc(__nmemb,0x10);
  __ptr_02 = calloc(__nmemb,0x10);
  auVar25 = ZEXT416((uint)CONCAT71(in_register_00000081,weight_gapO));
  auVar25 = pshuflw(auVar25,auVar25,0);
  auVar25._4_4_ = auVar25._0_4_;
  auVar25._8_4_ = auVar25._0_4_;
  auVar25._12_4_ = auVar25._0_4_;
  auVar26 = ZEXT416((uint)CONCAT71(in_register_00000089,weight_gapE));
  auVar26 = pshuflw(auVar26,auVar26,0);
  auVar26._4_4_ = auVar26._0_4_;
  auVar26._8_4_ = auVar26._0_4_;
  auVar26._12_4_ = auVar26._0_4_;
  uVar15 = uVar15 & 0xffffffff;
  if (iVar23 < 1) {
    uVar15 = 0;
  }
  bVar24 = ref_dir != '\x01';
  local_60 = 0;
  uVar14 = (long)(refLen + -1);
  if (bVar24) {
    uVar14 = 0;
  }
  uVar19 = 0xffffffffffffffff;
  if (bVar24) {
    uVar19 = (long)refLen;
  }
  lVar17 = uVar15 * 0x10;
  uVar35 = 0;
  uVar36 = 0;
  uVar37 = 0;
  uVar38 = 0;
  uVar39 = 0;
  uVar40 = 0;
  uVar41 = 0;
  uVar42 = 0;
  uVar27 = 0;
  uVar28 = 0;
  uVar29 = 0;
  uVar30 = 0;
  uVar31 = 0;
  uVar32 = 0;
  uVar33 = 0;
  uVar34 = 0;
  uVar22 = 0;
  do {
    pvVar20 = pvVar12;
    pvVar12 = pvVar20;
    if (uVar14 == uVar19) break;
    puVar1 = (ulong *)((long)__ptr_00 + (long)(iVar23 + -1) * 0x10);
    uVar15 = *puVar1;
    auVar57._0_8_ = uVar15 << 0x10;
    auVar57._8_8_ = puVar1[1] << 0x10 | uVar15 >> 0x30;
    cVar4 = ref[uVar14];
    uVar43 = 0;
    uVar44 = 0;
    uVar45 = 0;
    uVar46 = 0;
    uVar47 = 0;
    uVar48 = 0;
    uVar49 = 0;
    uVar50 = 0;
    auVar52 = (undefined1  [16])0x0;
    for (lVar21 = 0; lVar17 != lVar21; lVar21 = lVar21 + 0x10) {
      auVar56 = paddsw(auVar57,*(undefined1 (*) [16])((long)vProfile[cVar4 * iVar23] + lVar21));
      auVar57 = *(undefined1 (*) [16])((long)__ptr_01 + lVar21);
      sVar54 = auVar52._0_2_;
      sVar55 = auVar57._0_2_;
      uVar66 = (ushort)(sVar55 < sVar54) * sVar54 | (ushort)(sVar55 >= sVar54) * sVar55;
      sVar54 = auVar52._2_2_;
      sVar55 = auVar57._2_2_;
      uVar68 = (ushort)(sVar55 < sVar54) * sVar54 | (ushort)(sVar55 >= sVar54) * sVar55;
      sVar54 = auVar52._4_2_;
      sVar55 = auVar57._4_2_;
      uVar69 = (ushort)(sVar55 < sVar54) * sVar54 | (ushort)(sVar55 >= sVar54) * sVar55;
      sVar54 = auVar52._6_2_;
      sVar55 = auVar57._6_2_;
      uVar70 = (ushort)(sVar55 < sVar54) * sVar54 | (ushort)(sVar55 >= sVar54) * sVar55;
      sVar54 = auVar52._8_2_;
      sVar55 = auVar57._8_2_;
      uVar71 = (ushort)(sVar55 < sVar54) * sVar54 | (ushort)(sVar55 >= sVar54) * sVar55;
      sVar54 = auVar52._10_2_;
      sVar55 = auVar57._10_2_;
      uVar72 = (ushort)(sVar55 < sVar54) * sVar54 | (ushort)(sVar55 >= sVar54) * sVar55;
      sVar54 = auVar52._12_2_;
      sVar55 = auVar57._12_2_;
      sVar75 = auVar57._14_2_;
      uVar73 = (ushort)(sVar55 < sVar54) * sVar54 | (ushort)(sVar55 >= sVar54) * sVar55;
      sVar54 = auVar52._14_2_;
      uVar74 = (ushort)(sVar75 < sVar54) * sVar54 | (ushort)(sVar75 >= sVar54) * sVar75;
      sVar54 = auVar56._0_2_;
      auVar67._0_2_ = (ushort)((short)uVar66 < sVar54) * sVar54 | ((short)uVar66 >= sVar54) * uVar66
      ;
      sVar54 = auVar56._2_2_;
      auVar67._2_2_ = (ushort)((short)uVar68 < sVar54) * sVar54 | ((short)uVar68 >= sVar54) * uVar68
      ;
      sVar54 = auVar56._4_2_;
      auVar67._4_2_ = (ushort)((short)uVar69 < sVar54) * sVar54 | ((short)uVar69 >= sVar54) * uVar69
      ;
      sVar54 = auVar56._6_2_;
      auVar67._6_2_ = (ushort)((short)uVar70 < sVar54) * sVar54 | ((short)uVar70 >= sVar54) * uVar70
      ;
      sVar54 = auVar56._8_2_;
      auVar67._8_2_ = (ushort)((short)uVar71 < sVar54) * sVar54 | ((short)uVar71 >= sVar54) * uVar71
      ;
      sVar54 = auVar56._10_2_;
      auVar67._10_2_ =
           (ushort)((short)uVar72 < sVar54) * sVar54 | ((short)uVar72 >= sVar54) * uVar72;
      sVar54 = auVar56._12_2_;
      auVar67._12_2_ =
           (ushort)((short)uVar73 < sVar54) * sVar54 | ((short)uVar73 >= sVar54) * uVar73;
      sVar54 = auVar56._14_2_;
      auVar67._14_2_ =
           (ushort)((short)uVar74 < sVar54) * sVar54 | ((short)uVar74 >= sVar54) * uVar74;
      uVar43 = ((short)uVar43 < (short)auVar67._0_2_) * auVar67._0_2_ |
               ((short)uVar43 >= (short)auVar67._0_2_) * uVar43;
      uVar44 = ((short)uVar44 < (short)auVar67._2_2_) * auVar67._2_2_ |
               ((short)uVar44 >= (short)auVar67._2_2_) * uVar44;
      uVar45 = ((short)uVar45 < (short)auVar67._4_2_) * auVar67._4_2_ |
               ((short)uVar45 >= (short)auVar67._4_2_) * uVar45;
      uVar46 = ((short)uVar46 < (short)auVar67._6_2_) * auVar67._6_2_ |
               ((short)uVar46 >= (short)auVar67._6_2_) * uVar46;
      uVar47 = ((short)uVar47 < (short)auVar67._8_2_) * auVar67._8_2_ |
               ((short)uVar47 >= (short)auVar67._8_2_) * uVar47;
      uVar48 = ((short)uVar48 < (short)auVar67._10_2_) * auVar67._10_2_ |
               ((short)uVar48 >= (short)auVar67._10_2_) * uVar48;
      uVar49 = ((short)uVar49 < (short)auVar67._12_2_) * auVar67._12_2_ |
               ((short)uVar49 >= (short)auVar67._12_2_) * uVar49;
      uVar50 = ((short)uVar50 < (short)auVar67._14_2_) * auVar67._14_2_ |
               ((short)uVar50 >= (short)auVar67._14_2_) * uVar50;
      *(undefined1 (*) [16])((long)pvVar20 + lVar21) = auVar67;
      auVar56 = psubusw(auVar67,auVar25);
      auVar57 = psubusw(auVar57,auVar26);
      sVar54 = auVar56._0_2_;
      sVar51 = auVar57._0_2_;
      sVar55 = auVar56._2_2_;
      sVar59 = auVar57._2_2_;
      sVar75 = auVar56._4_2_;
      sVar60 = auVar57._4_2_;
      sVar5 = auVar56._6_2_;
      sVar61 = auVar57._6_2_;
      sVar6 = auVar56._8_2_;
      sVar62 = auVar57._8_2_;
      sVar7 = auVar56._10_2_;
      sVar63 = auVar57._10_2_;
      sVar8 = auVar56._12_2_;
      sVar64 = auVar57._12_2_;
      sVar65 = auVar57._14_2_;
      sVar9 = auVar56._14_2_;
      puVar2 = (ushort *)((long)__ptr_01 + lVar21);
      *puVar2 = (ushort)(sVar51 < sVar54) * sVar54 | (ushort)(sVar51 >= sVar54) * sVar51;
      puVar2[1] = (ushort)(sVar59 < sVar55) * sVar55 | (ushort)(sVar59 >= sVar55) * sVar59;
      puVar2[2] = (ushort)(sVar60 < sVar75) * sVar75 | (ushort)(sVar60 >= sVar75) * sVar60;
      puVar2[3] = (ushort)(sVar61 < sVar5) * sVar5 | (ushort)(sVar61 >= sVar5) * sVar61;
      puVar2[4] = (ushort)(sVar62 < sVar6) * sVar6 | (ushort)(sVar62 >= sVar6) * sVar62;
      puVar2[5] = (ushort)(sVar63 < sVar7) * sVar7 | (ushort)(sVar63 >= sVar7) * sVar63;
      puVar2[6] = (ushort)(sVar64 < sVar8) * sVar8 | (ushort)(sVar64 >= sVar8) * sVar64;
      puVar2[7] = (ushort)(sVar65 < sVar9) * sVar9 | (ushort)(sVar65 >= sVar9) * sVar65;
      auVar57 = psubusw(auVar52,auVar26);
      sVar51 = auVar57._0_2_;
      auVar52._0_2_ = (ushort)(sVar51 < sVar54) * sVar54 | (ushort)(sVar51 >= sVar54) * sVar51;
      sVar54 = auVar57._2_2_;
      auVar52._2_2_ = (ushort)(sVar54 < sVar55) * sVar55 | (ushort)(sVar54 >= sVar55) * sVar54;
      sVar54 = auVar57._4_2_;
      auVar52._4_2_ = (ushort)(sVar54 < sVar75) * sVar75 | (ushort)(sVar54 >= sVar75) * sVar54;
      sVar54 = auVar57._6_2_;
      auVar52._6_2_ = (ushort)(sVar54 < sVar5) * sVar5 | (ushort)(sVar54 >= sVar5) * sVar54;
      sVar54 = auVar57._8_2_;
      auVar52._8_2_ = (ushort)(sVar54 < sVar6) * sVar6 | (ushort)(sVar54 >= sVar6) * sVar54;
      sVar54 = auVar57._10_2_;
      auVar52._10_2_ = (ushort)(sVar54 < sVar7) * sVar7 | (ushort)(sVar54 >= sVar7) * sVar54;
      sVar54 = auVar57._12_2_;
      sVar55 = auVar57._14_2_;
      auVar52._12_2_ = (ushort)(sVar54 < sVar8) * sVar8 | (ushort)(sVar54 >= sVar8) * sVar54;
      auVar52._14_2_ = (ushort)(sVar55 < sVar9) * sVar9 | (ushort)(sVar55 >= sVar9) * sVar55;
      auVar57 = *(undefined1 (*) [16])((long)__ptr_00 + lVar21);
    }
    for (iVar18 = 0; iVar18 != 8; iVar18 = iVar18 + 1) {
      lVar21 = auVar52._8_8_;
      uVar15 = auVar52._0_8_;
      auVar52._0_8_ = uVar15 << 0x10;
      auVar52._8_8_ = lVar21 << 0x10 | uVar15 >> 0x30;
      for (lVar21 = 0; lVar17 != lVar21; lVar21 = lVar21 + 0x10) {
        psVar3 = (short *)((long)pvVar20 + lVar21);
        sVar55 = *psVar3;
        sVar75 = psVar3[1];
        sVar5 = psVar3[2];
        sVar6 = psVar3[3];
        sVar7 = psVar3[4];
        sVar8 = psVar3[5];
        sVar9 = psVar3[6];
        sVar51 = psVar3[7];
        sVar54 = auVar52._0_2_;
        auVar56._0_2_ = (ushort)(sVar55 < sVar54) * sVar54 | (ushort)(sVar55 >= sVar54) * sVar55;
        sVar54 = auVar52._2_2_;
        auVar56._2_2_ = (ushort)(sVar75 < sVar54) * sVar54 | (ushort)(sVar75 >= sVar54) * sVar75;
        sVar54 = auVar52._4_2_;
        auVar56._4_2_ = (ushort)(sVar5 < sVar54) * sVar54 | (ushort)(sVar5 >= sVar54) * sVar5;
        sVar54 = auVar52._6_2_;
        auVar56._6_2_ = (ushort)(sVar6 < sVar54) * sVar54 | (ushort)(sVar6 >= sVar54) * sVar6;
        sVar54 = auVar52._8_2_;
        auVar56._8_2_ = (ushort)(sVar7 < sVar54) * sVar54 | (ushort)(sVar7 >= sVar54) * sVar7;
        sVar54 = auVar52._10_2_;
        auVar56._10_2_ = (ushort)(sVar8 < sVar54) * sVar54 | (ushort)(sVar8 >= sVar54) * sVar8;
        sVar54 = auVar52._12_2_;
        auVar56._12_2_ = (ushort)(sVar9 < sVar54) * sVar54 | (ushort)(sVar9 >= sVar54) * sVar9;
        sVar54 = auVar52._14_2_;
        auVar56._14_2_ = (ushort)(sVar51 < sVar54) * sVar54 | (ushort)(sVar51 >= sVar54) * sVar51;
        uVar43 = ((short)uVar43 < (short)auVar56._0_2_) * auVar56._0_2_ |
                 ((short)uVar43 >= (short)auVar56._0_2_) * uVar43;
        uVar44 = ((short)uVar44 < (short)auVar56._2_2_) * auVar56._2_2_ |
                 ((short)uVar44 >= (short)auVar56._2_2_) * uVar44;
        uVar45 = ((short)uVar45 < (short)auVar56._4_2_) * auVar56._4_2_ |
                 ((short)uVar45 >= (short)auVar56._4_2_) * uVar45;
        uVar46 = ((short)uVar46 < (short)auVar56._6_2_) * auVar56._6_2_ |
                 ((short)uVar46 >= (short)auVar56._6_2_) * uVar46;
        uVar47 = ((short)uVar47 < (short)auVar56._8_2_) * auVar56._8_2_ |
                 ((short)uVar47 >= (short)auVar56._8_2_) * uVar47;
        uVar48 = ((short)uVar48 < (short)auVar56._10_2_) * auVar56._10_2_ |
                 ((short)uVar48 >= (short)auVar56._10_2_) * uVar48;
        uVar49 = ((short)uVar49 < (short)auVar56._12_2_) * auVar56._12_2_ |
                 ((short)uVar49 >= (short)auVar56._12_2_) * uVar49;
        uVar50 = ((short)uVar50 < (short)auVar56._14_2_) * auVar56._14_2_ |
                 ((short)uVar50 >= (short)auVar56._14_2_) * uVar50;
        *(undefined1 (*) [16])((long)pvVar20 + lVar21) = auVar56;
        auVar57 = psubusw(auVar56,auVar25);
        auVar52 = psubusw(auVar52,auVar26);
        auVar58._0_2_ = -(ushort)(auVar57._0_2_ < auVar52._0_2_);
        auVar58._2_2_ = -(ushort)(auVar57._2_2_ < auVar52._2_2_);
        auVar58._4_2_ = -(ushort)(auVar57._4_2_ < auVar52._4_2_);
        auVar58._6_2_ = -(ushort)(auVar57._6_2_ < auVar52._6_2_);
        auVar58._8_2_ = -(ushort)(auVar57._8_2_ < auVar52._8_2_);
        auVar58._10_2_ = -(ushort)(auVar57._10_2_ < auVar52._10_2_);
        auVar58._12_2_ = -(ushort)(auVar57._12_2_ < auVar52._12_2_);
        auVar58._14_2_ = -(ushort)(auVar57._14_2_ < auVar52._14_2_);
        if ((((((((((((((((auVar58 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar58 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar58 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar58 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar58 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar58 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar58 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar58 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar58 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar58 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar58 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar58 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar58 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar58._14_2_ >> 7 & 1) == 0) && (auVar58._14_2_ & 0x8000) == 0) goto LAB_001042c2;
      }
    }
LAB_001042c2:
    uVar27 = ((short)uVar27 < (short)uVar43) * uVar43 | ((short)uVar27 >= (short)uVar43) * uVar27;
    uVar28 = ((short)uVar28 < (short)uVar44) * uVar44 | ((short)uVar28 >= (short)uVar44) * uVar28;
    uVar29 = ((short)uVar29 < (short)uVar45) * uVar45 | ((short)uVar29 >= (short)uVar45) * uVar29;
    uVar30 = ((short)uVar30 < (short)uVar46) * uVar46 | ((short)uVar30 >= (short)uVar46) * uVar30;
    uVar31 = ((short)uVar31 < (short)uVar47) * uVar47 | ((short)uVar31 >= (short)uVar47) * uVar31;
    uVar32 = ((short)uVar32 < (short)uVar48) * uVar48 | ((short)uVar32 >= (short)uVar48) * uVar32;
    uVar33 = ((short)uVar33 < (short)uVar49) * uVar49 | ((short)uVar33 >= (short)uVar49) * uVar33;
    uVar34 = ((short)uVar34 < (short)uVar50) * uVar50 | ((short)uVar34 >= (short)uVar50) * uVar34;
    auVar53._0_2_ = -(ushort)(uVar35 == uVar27);
    auVar53._2_2_ = -(ushort)(uVar36 == uVar28);
    auVar53._4_2_ = -(ushort)(uVar37 == uVar29);
    auVar53._6_2_ = -(ushort)(uVar38 == uVar30);
    auVar53._8_2_ = -(ushort)(uVar39 == uVar31);
    auVar53._10_2_ = -(ushort)(uVar40 == uVar32);
    auVar53._12_2_ = -(ushort)(uVar41 == uVar33);
    auVar53._14_2_ = -(ushort)(uVar42 == uVar34);
    if (((ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) | (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                  (ushort)((byte)(auVar53._14_2_ >> 7) & 1) << 0xe | auVar53._14_2_ & 0x8000) !=
         0xffff) &&
       (uVar35 = ((short)uVar31 < (short)uVar27) * uVar27 |
                 ((short)uVar31 >= (short)uVar27) * uVar31,
       uVar36 = ((short)uVar32 < (short)uVar28) * uVar28 | ((short)uVar32 >= (short)uVar28) * uVar32
       , uVar37 = ((short)uVar33 < (short)uVar29) * uVar29 |
                  ((short)uVar33 >= (short)uVar29) * uVar33,
       uVar38 = ((short)uVar34 < (short)uVar30) * uVar30 | ((short)uVar34 >= (short)uVar30) * uVar34
       , uVar35 = ((short)uVar37 < (short)uVar35) * uVar35 |
                  ((short)uVar37 >= (short)uVar35) * uVar37,
       uVar36 = ((short)uVar38 < (short)uVar36) * uVar36 | ((short)uVar38 >= (short)uVar36) * uVar38
       , uVar66 = ((short)uVar36 < (short)uVar35) * uVar35 |
                  ((short)uVar36 >= (short)uVar35) * uVar36, uVar35 = uVar27, uVar36 = uVar28,
       uVar37 = uVar29, uVar38 = uVar30, uVar39 = uVar31, uVar40 = uVar32, uVar41 = uVar33,
       uVar42 = uVar34, uVar22 < uVar66)) {
      for (lVar21 = 0; lVar17 != lVar21; lVar21 = lVar21 + 0x10) {
        uVar11 = ((undefined8 *)((long)pvVar20 + lVar21))[1];
        *(undefined8 *)((long)__ptr_02 + lVar21) = *(undefined8 *)((long)pvVar20 + lVar21);
        ((undefined8 *)((long)__ptr_02 + lVar21))[1] = uVar11;
      }
      local_60 = uVar14 & 0xffffffff;
      uVar22 = uVar66;
    }
    uVar43 = ((short)uVar47 < (short)uVar43) * uVar43 | ((short)uVar47 >= (short)uVar43) * uVar47;
    uVar44 = ((short)uVar48 < (short)uVar44) * uVar44 | ((short)uVar48 >= (short)uVar44) * uVar48;
    uVar45 = ((short)uVar49 < (short)uVar45) * uVar45 | ((short)uVar49 >= (short)uVar45) * uVar49;
    uVar46 = ((short)uVar50 < (short)uVar46) * uVar46 | ((short)uVar50 >= (short)uVar46) * uVar50;
    uVar43 = ((short)uVar45 < (short)uVar43) * uVar43 | ((short)uVar45 >= (short)uVar43) * uVar45;
    uVar44 = ((short)uVar46 < (short)uVar44) * uVar44 | ((short)uVar46 >= (short)uVar44) * uVar46;
    uVar43 = ((short)uVar44 < (short)uVar43) * uVar43 | ((short)uVar44 >= (short)uVar43) * uVar44;
    *(ushort *)((long)__ptr + uVar14 * 2) = uVar43;
    uVar14 = uVar14 + (ulong)bVar24 * 2 + -1;
    pvVar12 = __ptr_00;
    __ptr_00 = pvVar20;
  } while (uVar43 != terminate);
  uVar14 = 0;
  uVar15 = (ulong)(uint)(iVar23 * 8);
  if (iVar23 * 8 < 1) {
    uVar15 = uVar14;
  }
  for (; (uint)uVar15 != (uint)uVar14; uVar14 = uVar14 + 1) {
    if ((*(uint16_t *)((long)__ptr_02 + uVar14 * 2) == uVar22) &&
       (iVar18 = ((uint)uVar14 & 7) * iVar23 + ((uint)(uVar14 >> 3) & 0x1fffffff), iVar18 < iVar16))
    {
      iVar16 = iVar18;
    }
  }
  free(__ptr_02);
  free(__ptr_01);
  free(pvVar12);
  free(__ptr_00);
  paVar13 = (alignment_end *)calloc(2,0xc);
  paVar13->score = uVar22;
  paVar13->ref = (int)local_60;
  paVar13->read = iVar16;
  paVar13[1].score = 0;
  paVar13[1].ref = 0;
  paVar13[1].read = 0;
  uVar35 = 0;
  uVar10 = (int)local_60 - maskLen;
  if ((int)local_60 - maskLen < 1) {
    uVar10 = 0;
  }
  for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
    uVar36 = *(ushort *)((long)__ptr + uVar15 * 2);
    if (uVar35 < uVar36) {
      paVar13[1].score = uVar36;
      paVar13[1].ref = (int32_t)uVar15;
      uVar35 = uVar36;
    }
  }
  iVar16 = (int)local_60 + maskLen;
  if (refLen <= (int)local_60 + maskLen) {
    iVar16 = refLen;
  }
  for (lVar17 = (long)iVar16; refLen != (int)lVar17; lVar17 = lVar17 + 1) {
    uVar36 = *(ushort *)((long)__ptr + lVar17 * 2);
    if (uVar35 < uVar36) {
      paVar13[1].score = uVar36;
      paVar13[1].ref = (int)lVar17;
      uVar35 = uVar36;
    }
  }
  free(__ptr);
  return paVar13;
}

Assistant:

static alignment_end* sw_sse2_word (const int8_t* ref,
							 int8_t ref_dir,	/* 0: forward ref; 1: reverse ref*/
							 int32_t refLen,
							 int32_t readLen,
							 const uint8_t weight_gapO, /* will be used as - */
							 const uint8_t weight_gapE, /* will be used as - */
							 const __m128i* vProfile,
							 uint16_t terminate,
							 int32_t maskLen) {

#define max8(m, vm) (vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 8)); \
					(vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 4)); \
					(vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 2)); \
					(m) = _mm_extract_epi16((vm), 0)

	uint16_t max = 0;		                     /* the max alignment score */
	int32_t end_read = readLen - 1;
	int32_t end_ref = 0; /* 1_based best alignment ending point; Initialized as isn't aligned - 0. */
	int32_t segLen = (readLen + 7) / 8; /* number of segment */

	/* array to record the largest score of each reference position */
	uint16_t* maxColumn = (uint16_t*) calloc(refLen, 2);

	/* array to record the alignment read ending position of the largest score of each reference position */
	int32_t* end_read_column = (int32_t*) calloc(refLen, sizeof(int32_t));

	/* Define 16 byte 0 vector. */
	__m128i vZero = _mm_set1_epi32(0);

	__m128i* pvHStore = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvHLoad = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvE = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvHmax = (__m128i*) calloc(segLen, sizeof(__m128i));

	int32_t i, j, k;
	/* 16 byte insertion begin vector */
	__m128i vGapO = _mm_set1_epi16(weight_gapO);

	/* 16 byte insertion extension vector */
	__m128i vGapE = _mm_set1_epi16(weight_gapE);

	__m128i vMaxScore = vZero; /* Trace the highest score of the whole SW matrix. */
	__m128i vMaxMark = vZero; /* Trace the highest score till the previous column. */
	__m128i vTemp;
	int32_t edge, begin = 0, end = refLen, step = 1;
	uint16_t *t;
	int32_t column_len;
	alignment_end* bests;

	/* outer loop to process the reference sequence */
	if (ref_dir == 1) {
		begin = refLen - 1;
		end = -1;
		step = -1;
	}
	for (i = begin; LIKELY(i != end); i += step) {
		__m128i* pv;
		__m128i vMaxColumn;
		const __m128i* vP;
		int32_t cmp;
		__m128i e, vF = vZero; /* Initialize F value to 0.
							   Any errors to vH values will be corrected in the Lazy_F loop.
							 */
		__m128i vH = pvHStore[segLen - 1];
		vH = _mm_slli_si128 (vH, 2); /* Shift the 128-bit value in vH left by 2 byte. */

		/* Swap the 2 H buffers. */
		pv = pvHLoad;

		vMaxColumn = vZero; /* vMaxColumn is used to record the max values of column i. */

		vP = vProfile + ref[i] * segLen; /* Right part of the vProfile */
		pvHLoad = pvHStore;
		pvHStore = pv;

		/* inner loop to process the query sequence */
		for (j = 0; LIKELY(j < segLen); j ++) {
			vH = _mm_adds_epi16(vH, _mm_load_si128(vP + j));

			/* Get max from vH, vE and vF. */
			e = _mm_load_si128(pvE + j);
			vH = _mm_max_epi16(vH, e);
			vH = _mm_max_epi16(vH, vF);
			vMaxColumn = _mm_max_epi16(vMaxColumn, vH);

			/* Save vH values. */
			_mm_store_si128(pvHStore + j, vH);

			/* Update vE value. */
			vH = _mm_subs_epu16(vH, vGapO); /* saturation arithmetic, result >= 0 */
			e = _mm_subs_epu16(e, vGapE);
			e = _mm_max_epi16(e, vH);
			_mm_store_si128(pvE + j, e);

			/* Update vF value. */
			vF = _mm_subs_epu16(vF, vGapE);
			vF = _mm_max_epi16(vF, vH);

			/* Load the next vH. */
			vH = _mm_load_si128(pvHLoad + j);
		}

		/* Lazy_F loop: has been revised to disallow adjecent insertion and then deletion, so don't update E(i, j), learn from SWPS3 */
		for (k = 0; LIKELY(k < 8); ++k) {
			vF = _mm_slli_si128 (vF, 2);
			for (j = 0; LIKELY(j < segLen); ++j) {
				vH = _mm_load_si128(pvHStore + j);
				vH = _mm_max_epi16(vH, vF);
				vMaxColumn = _mm_max_epi16(vMaxColumn, vH); /*newly added line*/
				_mm_store_si128(pvHStore + j, vH);
				vH = _mm_subs_epu16(vH, vGapO);
				vF = _mm_subs_epu16(vF, vGapE);
				if (UNLIKELY(! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH)))) goto end;
			}
		}

end:
		vMaxScore = _mm_max_epi16(vMaxScore, vMaxColumn);
		vTemp = _mm_cmpeq_epi16(vMaxMark, vMaxScore);
		cmp = _mm_movemask_epi8(vTemp);
		if (cmp != 0xffff) {
			uint16_t temp;
			vMaxMark = vMaxScore;
			max8(temp, vMaxScore);
			vMaxScore = vMaxMark;

			if (LIKELY(temp > max)) {
				max = temp;
				end_ref = i;
				for (j = 0; LIKELY(j < segLen); ++j) pvHmax[j] = pvHStore[j];
			}
		}

		/* Record the max score of current column. */
		max8(maxColumn[i], vMaxColumn);
		if (maxColumn[i] == terminate) break;
	}

	/* Trace the alignment ending position on read. */
	t = (uint16_t*)pvHmax;
	column_len = segLen * 8;
	for (i = 0; LIKELY(i < column_len); ++i, ++t) {
		int32_t temp;
		if (*t == max) {
			temp = i / 8 + i % 8 * segLen;
			if (temp < end_read) end_read = temp;
		}
	}

	free(pvHmax);
	free(pvE);
	free(pvHLoad);
	free(pvHStore);

	/* Find the most possible 2nd best alignment. */
	bests = (alignment_end*) calloc(2, sizeof(alignment_end));
	bests[0].score = max;
	bests[0].ref = end_ref;
	bests[0].read = end_read;

	bests[1].score = 0;
	bests[1].ref = 0;
	bests[1].read = 0;

	edge = (end_ref - maskLen) > 0 ? (end_ref - maskLen) : 0;
	for (i = 0; i < edge; i ++) {
		if (maxColumn[i] > bests[1].score) {
			bests[1].score = maxColumn[i];
			bests[1].ref = i;
		}
	}
	edge = (end_ref + maskLen) > refLen ? refLen : (end_ref + maskLen);
	for (i = edge; i < refLen; i ++) {
		if (maxColumn[i] > bests[1].score) {
			bests[1].score = maxColumn[i];
			bests[1].ref = i;
		}
	}

	free(maxColumn);
	free(end_read_column);
	return bests;
}